

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::VarintParser<unsigned_int,false>
                 (void *object,char *ptr,ParseContext *ctx)

{
  char *pcVar1;
  ParseContext *ctx_local;
  char *ptr_local;
  void *object_local;
  
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::VarintParser<unsigned_int,false>(void*,char_const*,google::protobuf::internal::ParseContext*)::_lambda(unsigned_long)_1_>
                     (&ctx->super_EpsCopyInputStream,ptr,(anon_class_8_1_6424947d)object);
  return pcVar1;
}

Assistant:

const char* VarintParser(void* object, const char* ptr, ParseContext* ctx) {
  return ctx->ReadPackedVarint(ptr, [object](uint64_t varint) {
    T val;
    if (sign) {
      if (sizeof(T) == 8) {
        val = WireFormatLite::ZigZagDecode64(varint);
      } else {
        val = WireFormatLite::ZigZagDecode32(varint);
      }
    } else {
      val = varint;
    }
    static_cast<RepeatedField<T>*>(object)->Add(val);
  });
}